

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O2

RPCHelpMan * wallet::listaddressgroupings(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  RPCMethodImpl fun;
  undefined1 auVar1 [32];
  long lVar2;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined4 in_stack_fffffffffffff898;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffff89c;
  undefined8 in_stack_fffffffffffff8a0;
  undefined8 in_stack_fffffffffffff8a8;
  undefined8 in_stack_fffffffffffff8b0;
  _Manager_type in_stack_fffffffffffff8b8;
  undefined8 in_stack_fffffffffffff8c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff8c8;
  pointer in_stack_fffffffffffff8d8;
  pointer pRVar4;
  pointer in_stack_fffffffffffff8e0;
  pointer pRVar5;
  pointer in_stack_fffffffffffff8e8;
  pointer pRVar6;
  undefined8 in_stack_fffffffffffff8f0;
  pointer pRVar7;
  pointer pRVar8;
  pointer pRVar9;
  undefined8 in_stack_fffffffffffff910;
  pointer pRVar10;
  pointer pRVar11;
  pointer pRVar12;
  undefined1 in_stack_fffffffffffff930 [24];
  allocator<char> local_6a2;
  allocator<char> local_6a1;
  vector<RPCResult,_std::allocator<RPCResult>_> local_6a0;
  allocator<char> local_682;
  allocator<char> local_681;
  vector<RPCResult,_std::allocator<RPCResult>_> local_680;
  allocator<char> local_662;
  allocator<char> local_661;
  RPCResults local_660;
  vector<RPCArg,_std::allocator<RPCArg>_> local_648;
  allocator<char> local_622;
  allocator<char> local_621;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  char *local_540;
  size_type local_538;
  char local_530 [8];
  undefined8 uStack_528;
  string local_520 [32];
  string local_500 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  RPCResult local_460 [3];
  string local_2c8 [32];
  string local_2a8 [32];
  RPCResult local_288;
  string local_200 [32];
  string local_1e0 [32];
  RPCResult local_1c0;
  string local_138 [32];
  string local_118 [32];
  RPCResult local_f8;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"listaddressgroupings",&local_621);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,
             "\nLists groups of addresses which have had their common ownership\nmade public by common use as inputs or as the resulting change\nin past transactions\n"
             ,&local_622);
  local_648.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_648.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_648.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_118,"",&local_661);
  std::__cxx11::string::string<std::allocator<char>>(local_138,"",&local_662);
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"",&local_681);
  std::__cxx11::string::string<std::allocator<char>>(local_200,"",&local_682);
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"",&local_6a1);
  std::__cxx11::string::string<std::allocator<char>>(local_2c8,"",&local_6a2);
  std::__cxx11::string::string<std::allocator<char>>
            (local_480,"address",(allocator<char> *)&stack0xfffffffffffff93f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4a0,"The bitcoin address",(allocator<char> *)&stack0xfffffffffffff93e);
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff89c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff898;
  m_key_name._M_string_length = in_stack_fffffffffffff8a0;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff8a8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff8b0;
  description._M_string_length = in_stack_fffffffffffff8c0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  description.field_2 = in_stack_fffffffffffff8c8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff8e0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff8d8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff8e8;
  RPCResult::RPCResult(local_460,STR,m_key_name,description,inner,SUB81(local_480,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_4c0,"amount",(allocator<char> *)&stack0xfffffffffffff917);
  std::operator+(&local_4e0,"The amount in ",&::CURRENCY_UNIT_abi_cxx11_);
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff89c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff898;
  m_key_name_00._M_string_length = in_stack_fffffffffffff8a0;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff8a8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff8b0;
  description_00._M_string_length = in_stack_fffffffffffff8c0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  description_00.field_2 = in_stack_fffffffffffff8c8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff8e0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff8d8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff8e8;
  RPCResult::RPCResult
            (local_460 + 1,STR_AMOUNT,m_key_name_00,description_00,inner_00,SUB81(local_4c0,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_500,"label",(allocator<char> *)&stack0xfffffffffffff8f7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_520,"The label",(allocator<char> *)&stack0xfffffffffffff8f6);
  pRVar4 = (pointer)0x0;
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  uVar3 = 0;
  auVar1._4_8_ = in_stack_fffffffffffff8a0;
  auVar1._0_4_ = in_stack_fffffffffffff89c;
  auVar1._12_8_ = in_stack_fffffffffffff8a8;
  auVar1._20_8_ = in_stack_fffffffffffff8b0;
  auVar1._28_4_ = 0;
  description_01._M_string_length = in_stack_fffffffffffff8c0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  description_01.field_2._M_local_buf = in_stack_fffffffffffff8c8._M_local_buf;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult
            (local_460 + 2,STR,(string)(auVar1 << 0x20),false,description_01,inner_01,true);
  __l._M_len = 3;
  __l._M_array = local_460;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff940,__l,
             (allocator_type *)&stack0xfffffffffffff8d7);
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff89c;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar3;
  m_key_name_01._M_string_length = in_stack_fffffffffffff8a0;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff8a8;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff8b0;
  description_02._M_string_length = in_stack_fffffffffffff8c0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  description_02.field_2._M_local_buf = in_stack_fffffffffffff8c8._M_local_buf;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar5;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar4;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar6;
  RPCResult::RPCResult
            (&local_288,ARR_FIXED,m_key_name_01,description_02,inner_02,SUB81(local_2a8,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_288;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_6a0,__l_00,(allocator_type *)&stack0xfffffffffffff8d6);
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff89c;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar3;
  m_key_name_02._M_string_length = in_stack_fffffffffffff8a0;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff8a8;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff8b0;
  description_03._M_string_length = in_stack_fffffffffffff8c0;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  description_03.field_2._M_local_buf = in_stack_fffffffffffff8c8._M_local_buf;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar5;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar4;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar6;
  RPCResult::RPCResult(&local_1c0,ARR,m_key_name_02,description_03,inner_03,SUB81(local_1e0,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_1c0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_680,__l_01,(allocator_type *)&stack0xfffffffffffff8d5);
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff89c;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar3;
  m_key_name_03._M_string_length = in_stack_fffffffffffff8a0;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff8a8;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff8b0;
  description_04._M_string_length = in_stack_fffffffffffff8c0;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8b8;
  description_04.field_2 = in_stack_fffffffffffff8c8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar5;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar4;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar6;
  RPCResult::RPCResult(&local_f8,ARR,m_key_name_03,description_04,inner_04,SUB81(local_118,0));
  result._4_4_ = in_stack_fffffffffffff89c;
  result.m_type = uVar3;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff8a0;
  result.m_key_name._M_string_length = in_stack_fffffffffffff8a8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff8b0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff8b8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff8c0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff8c8;
  result._64_8_ = pRVar4;
  result.m_description._M_dataplus._M_p = (pointer)pRVar5;
  result.m_description._M_string_length = (size_type)pRVar6;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff8f0;
  result.m_description.field_2._8_8_ = pRVar7;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar8;
  result.m_cond._M_string_length = (size_type)pRVar9;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff910;
  result.m_cond.field_2._8_8_ = pRVar10;
  RPCResults::RPCResults(&local_660,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a0,"listaddressgroupings",(allocator<char> *)&stack0xfffffffffffff8d4
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c0,"",(allocator<char> *)&stack0xfffffffffffff8d3);
  HelpExampleCli(&local_580,&local_5a0,&local_5c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_600,"listaddressgroupings",(allocator<char> *)&stack0xfffffffffffff8d2
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_620,"",(allocator<char> *)&stack0xfffffffffffff8d1);
  HelpExampleRpc(&local_5e0,&local_600,&local_620);
  std::operator+(&local_560,&local_580,&local_5e0);
  local_540 = local_530;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p == &local_560.field_2) {
    uStack_528 = local_560.field_2._8_8_;
  }
  else {
    local_540 = local_560._M_dataplus._M_p;
  }
  local_538 = local_560._M_string_length;
  local_560._M_string_length = 0;
  local_560.field_2._M_local_buf[0] = '\0';
  description_05._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/addresses.cpp:183:9)>
       ::_M_invoke;
  description_05._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/rpc/addresses.cpp:183:9)>
                ::_M_manager;
  description_05.field_2 = in_stack_fffffffffffff8c8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar5;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar4;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar6;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar7;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff8f0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar8;
  examples.m_examples._M_string_length = in_stack_fffffffffffff910;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar9;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar10;
  examples.m_examples.field_2._8_8_ = pRVar11;
  fun._8_24_ = in_stack_fffffffffffff930;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar12;
  local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff8a0,&stack0xfffffffffffff8a8)),
             description_05,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff8a8);
  std::__cxx11::string::~string((string *)&local_540);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_620);
  std::__cxx11::string::~string((string *)&local_600);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_660.m_results);
  RPCResult::~RPCResult(&local_f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_680);
  RPCResult::~RPCResult(&local_1c0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_6a0);
  RPCResult::~RPCResult(&local_288);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff940);
  lVar2 = 0x110;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_460[0].m_type + lVar2));
    lVar2 = lVar2 + -0x88;
  } while (lVar2 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8d8);
  std::__cxx11::string::~string(local_520);
  std::__cxx11::string::~string(local_500);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff8f8);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string(local_4c0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff918);
  std::__cxx11::string::~string(local_4a0);
  std::__cxx11::string::~string(local_480);
  std::__cxx11::string::~string(local_2c8);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_118);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_648);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listaddressgroupings()
{
    return RPCHelpMan{"listaddressgroupings",
                "\nLists groups of addresses which have had their common ownership\n"
                "made public by common use as inputs or as the resulting change\n"
                "in past transactions\n",
                {},
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::ARR, "", "",
                        {
                            {RPCResult::Type::ARR_FIXED, "", "",
                            {
                                {RPCResult::Type::STR, "address", "The bitcoin address"},
                                {RPCResult::Type::STR_AMOUNT, "amount", "The amount in " + CURRENCY_UNIT},
                                {RPCResult::Type::STR, "label", /*optional=*/true, "The label"},
                            }},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("listaddressgroupings", "")
            + HelpExampleRpc("listaddressgroupings", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    LOCK(pwallet->cs_wallet);

    UniValue jsonGroupings(UniValue::VARR);
    std::map<CTxDestination, CAmount> balances = GetAddressBalances(*pwallet);
    for (const std::set<CTxDestination>& grouping : GetAddressGroupings(*pwallet)) {
        UniValue jsonGrouping(UniValue::VARR);
        for (const CTxDestination& address : grouping)
        {
            UniValue addressInfo(UniValue::VARR);
            addressInfo.push_back(EncodeDestination(address));
            addressInfo.push_back(ValueFromAmount(balances[address]));
            {
                const auto* address_book_entry = pwallet->FindAddressBookEntry(address);
                if (address_book_entry) {
                    addressInfo.push_back(address_book_entry->GetLabel());
                }
            }
            jsonGrouping.push_back(std::move(addressInfo));
        }
        jsonGroupings.push_back(std::move(jsonGrouping));
    }
    return jsonGroupings;
},
    };
}